

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void instrFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  char cVar1;
  Mem *pMem;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *__s1;
  char *__s2;
  sqlite3_value *pVal;
  sqlite3_value *pVal_00;
  sbyte sVar6;
  ulong val;
  ushort uVar7;
  uint uVar8;
  
  uVar8 = (*argv)->flags & 0x3f;
  uVar7 = argv[1]->flags & 0x3f;
  sVar6 = (sbyte)uVar7;
  if ((((uint)(0xaaaaaaaaaaaaaaaa >> sVar6) | (uint)(0xaaaaaaaaaaaaaaaa >> (sbyte)uVar8)) & 1) != 0)
  {
    return;
  }
  iVar3 = sqlite3ValueBytes(*argv,'\x01');
  iVar4 = sqlite3ValueBytes(argv[1],'\x01');
  if (iVar4 < 1) {
    val = 1;
    pVal = (sqlite3_value *)0x0;
    pVal_00 = (sqlite3_value *)0x0;
LAB_001a3af0:
    pMem = context->pOut;
    if ((pMem->flags & 0x9000) == 0) {
      (pMem->u).i = val;
      pMem->flags = 4;
    }
    else {
      vdbeReleaseAndSetInt64(pMem,val);
    }
    goto LAB_001a3b0a;
  }
  if (((byte)(0x1000000010001 >> sVar6) & (0x1000000010001U >> uVar8 & 1) != 0) == 1) {
    __s1 = (char *)sqlite3_value_blob(*argv);
    __s2 = (char *)sqlite3_value_blob(argv[1]);
LAB_001a39ab:
    if (__s2 == (char *)0x0) {
      pVal = (sqlite3_value *)0x0;
    }
    else {
      pVal = (sqlite3_value *)0x0;
      if (iVar3 == 0 || __s1 != (char *)0x0) {
        pVal_00 = (sqlite3_value *)0x0;
LAB_001a3a33:
        if (iVar3 < iVar4) {
          val = 0;
        }
        else {
          cVar1 = *__s2;
          uVar8 = 1;
          do {
            if ((*__s1 == cVar1) && (iVar5 = bcmp(__s1,__s2,(long)iVar4), iVar5 == 0))
            goto LAB_001a3adf;
            uVar8 = uVar8 + 1;
            __s1 = __s1 + 1;
            bVar2 = iVar4 < iVar3;
            iVar3 = iVar3 + -1;
          } while (bVar2);
          uVar8 = 0;
LAB_001a3adf:
          val = (ulong)uVar8;
        }
        goto LAB_001a3af0;
      }
    }
LAB_001a3a43:
    pVal_00 = (sqlite3_value *)0x0;
  }
  else {
    if (((0xfffefffffffefffeU >> uVar8 & 1) != 0) && ((0xfffefffffffefffeU >> uVar7 & 1) != 0)) {
      __s1 = (char *)sqlite3ValueText(*argv,'\x01');
      __s2 = (char *)sqlite3ValueText(argv[1],'\x01');
      goto LAB_001a39ab;
    }
    pVal = sqlite3_value_dup(*argv);
    __s1 = (char *)sqlite3ValueText(pVal,'\x01');
    if (__s1 == (char *)0x0) goto LAB_001a3a43;
    iVar3 = sqlite3ValueBytes(pVal,'\x01');
    pVal_00 = sqlite3_value_dup(argv[1]);
    __s2 = (char *)sqlite3ValueText(pVal_00,'\x01');
    if (__s2 != (char *)0x0) {
      iVar4 = sqlite3ValueBytes(pVal_00,'\x01');
      goto LAB_001a3a33;
    }
  }
  sqlite3_result_error_nomem(context);
LAB_001a3b0a:
  sqlite3ValueFree(pVal);
  sqlite3ValueFree(pVal_00);
  return;
}

Assistant:

static void instrFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *zHaystack;
  const unsigned char *zNeedle;
  int nHaystack;
  int nNeedle;
  int typeHaystack, typeNeedle;
  int N = 1;
  int isText;
  unsigned char firstChar;
  sqlite3_value *pC1 = 0;
  sqlite3_value *pC2 = 0;

  UNUSED_PARAMETER(argc);
  typeHaystack = sqlite3_value_type(argv[0]);
  typeNeedle = sqlite3_value_type(argv[1]);
  if( typeHaystack==SQLITE_NULL || typeNeedle==SQLITE_NULL ) return;
  nHaystack = sqlite3_value_bytes(argv[0]);
  nNeedle = sqlite3_value_bytes(argv[1]);
  if( nNeedle>0 ){
    if( typeHaystack==SQLITE_BLOB && typeNeedle==SQLITE_BLOB ){
      zHaystack = sqlite3_value_blob(argv[0]);
      zNeedle = sqlite3_value_blob(argv[1]);
      isText = 0;
    }else if( typeHaystack!=SQLITE_BLOB && typeNeedle!=SQLITE_BLOB ){
      zHaystack = sqlite3_value_text(argv[0]);
      zNeedle = sqlite3_value_text(argv[1]);
      isText = 1;
    }else{
      pC1 = sqlite3_value_dup(argv[0]);
      zHaystack = sqlite3_value_text(pC1);
      if( zHaystack==0 ) goto endInstrOOM;
      nHaystack = sqlite3_value_bytes(pC1);
      pC2 = sqlite3_value_dup(argv[1]);
      zNeedle = sqlite3_value_text(pC2);
      if( zNeedle==0 ) goto endInstrOOM;
      nNeedle = sqlite3_value_bytes(pC2);
      isText = 1;
    }
    if( zNeedle==0 || (nHaystack && zHaystack==0) ) goto endInstrOOM;
    firstChar = zNeedle[0];
    while( nNeedle<=nHaystack
       && (zHaystack[0]!=firstChar || memcmp(zHaystack, zNeedle, nNeedle)!=0)
    ){
      N++;
      do{
        nHaystack--;
        zHaystack++;
      }while( isText && (zHaystack[0]&0xc0)==0x80 );
    }
    if( nNeedle>nHaystack ) N = 0;
  }
  sqlite3_result_int(context, N);
endInstr:
  sqlite3_value_free(pC1);
  sqlite3_value_free(pC2);
  return;
endInstrOOM:
  sqlite3_result_error_nomem(context);
  goto endInstr;
}